

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<char>::dispose(ArrayBuilder<char> *this)

{
  char *firstElement;
  RemoveConst<char> *pRVar1;
  char *pcVar2;
  char *endCopy;
  char *posCopy;
  char *ptrCopy;
  ArrayBuilder<char> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pcVar2 = this->endPtr;
  if (firstElement != (char *)0x0) {
    this->ptr = (char *)0x0;
    this->pos = (RemoveConst<char> *)0x0;
    this->endPtr = (char *)0x0;
    ArrayDisposer::dispose<char>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement,
               (long)pcVar2 - (long)firstElement);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }